

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O3

void CALC_FCSLOT(OPL3_CH *CH,OPL3_SLOT *SLOT)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  int *in_RDX;
  uint uVar4;
  uchar uVar5;
  
  in_RDX[5] = (uint)*(byte *)((long)in_RDX + 0xf) * (int)CH;
  uVar1 = ((uint)SLOT & 0xff) >> (*(byte *)(in_RDX + 3) & 0x1f);
  if (uVar1 != *(byte *)((long)in_RDX + 0xe)) {
    *(char *)((long)in_RDX + 0xe) = (char)uVar1;
    uVar3 = *in_RDX + uVar1;
    if (uVar3 < 0x4c) {
      bVar2 = ""[uVar3];
      uVar4 = ~(-1 << (bVar2 & 0x1f));
      uVar5 = "pppppppppppppppp"[uVar3];
    }
    else {
      uVar5 = 'h';
      bVar2 = 0;
      uVar4 = 0;
    }
    *(byte *)(in_RDX + 0x12) = bVar2;
    in_RDX[0x11] = uVar4;
    *(uchar *)((long)in_RDX + 0x49) = uVar5;
    bVar2 = ""[in_RDX[1] + uVar1];
    *(byte *)(in_RDX + 0x14) = bVar2;
    in_RDX[0x13] = ~(-1 << (bVar2 & 0x1f));
    *(uchar *)((long)in_RDX + 0x51) = "pppppppppppppppp"[in_RDX[1] + uVar1];
    bVar2 = ""[uVar1 + in_RDX[2]];
    *(byte *)(in_RDX + 0x16) = bVar2;
    in_RDX[0x15] = ~(-1 << (bVar2 & 0x1f));
    *(uchar *)((long)in_RDX + 0x59) = "pppppppppppppppp"[uVar1 + in_RDX[2]];
  }
  return;
}

Assistant:

INLINE void CALC_FCSLOT(OPL_CH *CH,OPL_SLOT *SLOT)
{
	int ksr;

	/* (frequency) phase increment counter */
	SLOT->Incr = CH->fc * SLOT->mul;
	ksr = CH->kcode >> SLOT->KSR;

	if( SLOT->ksr != ksr )
	{
		SLOT->ksr = ksr;

		/* calculate envelope generator rates */
		if ((SLOT->ar + SLOT->ksr) < 16+62)
		{
			SLOT->eg_sh_ar  = eg_rate_shift [SLOT->ar + SLOT->ksr ];
			SLOT->eg_sel_ar = eg_rate_select[SLOT->ar + SLOT->ksr ];
		}
		else
		{
			SLOT->eg_sh_ar  = 0;
			SLOT->eg_sel_ar = 13*RATE_STEPS;
		}
		SLOT->eg_sh_dr  = eg_rate_shift [SLOT->dr + SLOT->ksr ];
		SLOT->eg_sel_dr = eg_rate_select[SLOT->dr + SLOT->ksr ];
		SLOT->eg_sh_rr  = eg_rate_shift [SLOT->rr + SLOT->ksr ];
		SLOT->eg_sel_rr = eg_rate_select[SLOT->rr + SLOT->ksr ];
	}
}